

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

EDLines * __thiscall EDLines::drawOnImage(EDLines *this)

{
  int *in_RSI;
  int iVar1;
  void *pvVar2;
  Scalar_<double> local_b0;
  Point_ local_90 [8];
  Point_ local_88 [8];
  _InputOutputArray local_80;
  int local_64;
  undefined1 local_60 [4];
  int i;
  _InputArray local_38;
  undefined1 local_19;
  EDLines *this_local;
  Mat *colorImage;
  
  local_19 = 0;
  pvVar2 = *(void **)(in_RSI + 2);
  this_local = this;
  cv::Mat::Mat((Mat *)this,in_RSI[1],*in_RSI,0,pvVar2,0);
  iVar1 = (int)pvVar2;
  cv::_InputArray::_InputArray(&local_38,(Mat *)this);
  cv::_OutputArray::_OutputArray((_OutputArray *)local_60,(Mat *)this);
  cv::cvtColor((cv *)&local_38,(_InputArray *)local_60,(_OutputArray *)0x8,0,iVar1);
  cv::_OutputArray::~_OutputArray((_OutputArray *)local_60);
  cv::_InputArray::~_InputArray(&local_38);
  for (local_64 = 0; local_64 < in_RSI[0x9c]; local_64 = local_64 + 1) {
    cv::_InputOutputArray::_InputOutputArray(&local_80,(Mat *)this);
    std::vector<LS,_std::allocator<LS>_>::operator[]
              ((vector<LS,_std::allocator<LS>_> *)(in_RSI + 0x96),(long)local_64);
    cv::Point_::operator_cast_to_Point_(local_88);
    std::vector<LS,_std::allocator<LS>_>::operator[]
              ((vector<LS,_std::allocator<LS>_> *)(in_RSI + 0x96),(long)local_64);
    cv::Point_::operator_cast_to_Point_(local_90);
    cv::Scalar_<double>::Scalar_(&local_b0,0.0,255.0,0.0,0.0);
    cv::line(&local_80,local_88,local_90,&local_b0,1,0x10,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_80);
  }
  return this;
}

Assistant:

Mat EDLines::drawOnImage()
{
	Mat colorImage = Mat(height, width, CV_8UC1, srcImg);
	cvtColor(colorImage, colorImage, COLOR_GRAY2BGR);
	for (int i = 0; i < linesNo; i++) {
		line(colorImage, linePoints[i].start, linePoints[i].end, Scalar(0, 255, 0), 1, LINE_AA, 0); // draw lines as green on image
	}

	return colorImage;
}